

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDAttDefList.cpp
# Opt level: O3

XMLAttDef * __thiscall
xercesc_4_0::DTDAttDefList::findAttDef(DTDAttDefList *this,XMLCh *param_1,XMLCh *attName)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *pRVar6;
  
  pRVar1 = this->fList;
  if ((attName == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*attName, uVar3 == 0)) {
    uVar3 = 0;
  }
  else {
    XVar5 = attName[1];
    if (XVar5 != L'\0') {
      pXVar4 = attName + 2;
      do {
        uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
        XVar5 = *pXVar4;
        pXVar4 = pXVar4 + 1;
      } while (XVar5 != L'\0');
    }
    uVar3 = uVar3 % pRVar1->fHashModulus;
  }
  pRVar6 = pRVar1->fBucketList[uVar3];
  if (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0) {
    do {
      bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,attName,pRVar6->fKey);
      if (bVar2) {
        return &pRVar6->fData->super_XMLAttDef;
      }
      pRVar6 = pRVar6->fNext;
    } while (pRVar6 != (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> *)0x0);
  }
  return (XMLAttDef *)0x0;
}

Assistant:

XMLAttDef* DTDAttDefList::findAttDef(   const   XMLCh* const
                                        , const XMLCh* const    attName)
{
    // We don't use the URI, so we just look up the name
    return fList->get(attName);
}